

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

bool GEO::String::string_to_signed_integer<int>(char *s,int *value)

{
  bool bVar1;
  char *in_RAX;
  int *piVar2;
  longlong lVar3;
  char *end;
  
  end = in_RAX;
  piVar2 = __errno_location();
  *piVar2 = 0;
  lVar3 = strtoll(s,&end,10);
  if (((end == s) || (*end != '\0')) || ((int)lVar3 != lVar3 || *piVar2 != 0)) {
    bVar1 = false;
  }
  else {
    *value = (int)lVar3;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

inline bool string_to_signed_integer(const char* s, T& value) {
            errno = 0;
            char* end;
#ifdef GEO_OS_WINDOWS
            Numeric::int64 v = _strtoi64(s, &end, 10);
#else
            Numeric::int64 v = strtoll(s, &end, 10);
#endif
            if(
                end != s && *end == '\0' && errno == 0 &&
                v >= std::numeric_limits<T>::min() &&
                v <= std::numeric_limits<T>::max()
            ) {
                value = static_cast<T>(v);
                return true;
            }

            return false;
        }